

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

LineInterpolationRange __thiscall
tcu::(anonymous_namespace)::
calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
          (_anonymous_namespace_ *this,Vec2 *pa,float wa,Vec2 *pb,float wb,IVec2 *pixel,
          int subpixelBits,
          _func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
          *weightEquation)

{
  LineInterpolationRange LVar2;
  Vec2 maxWeights;
  LineInterpolationRange weights [4];
  Vec2 minWeights;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  undefined8 local_68;
  float local_60;
  float local_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float local_4c;
  undefined8 local_40;
  Vector<float,_2> local_38;
  Vec2 VVar1;
  
  fStack_50 = (float)(subpixelBits * -0x800000 + 0x40000000);
  local_4c = 0.5 - fStack_50 * 0.5;
  local_60 = local_4c + (float)(int)*(undefined8 *)pixel->m_data;
  local_4c = local_4c + (float)(int)((ulong)*(undefined8 *)pixel->m_data >> 0x20);
  local_68 = CONCAT44(local_4c,local_60);
  local_5c = local_4c + fStack_50;
  fStack_58 = local_60 + fStack_50;
  fStack_54 = local_4c + fStack_50;
  fStack_50 = local_60 + fStack_50;
  (*weightEquation)(&local_a8,wa,pa,wb,pb);
  (*weightEquation)(&local_98,wa,pa,wb,pb);
  (*weightEquation)(&local_88,wa,pa,wb,pb);
  LVar2 = (*weightEquation)(&local_78,wa,pa,wb,pb);
  VVar1 = LVar2.min.m_data;
  min<float,2>(&local_a0,&local_90);
  min<float,2>(&local_80,&local_70);
  min<float,2>(&local_b8,&local_b0);
  max<float,2>(&local_a8,&local_98);
  max<float,2>(&local_88,&local_78);
  LVar2.max.m_data = max<float,2>(&local_b0,&local_38);
  *(undefined8 *)(this + 8) = local_40;
  *(float (*) [2])this = local_b8.m_data;
  LVar2.min.m_data[0] = VVar1.m_data[0];
  LVar2.min.m_data[1] = VVar1.m_data[1];
  return LVar2;
}

Assistant:

LineInterpolationRange calcSingleSampleLineInterpolationRangeWithWeightEquation (const tcu::Vec2&	pa,
																				 float				wa,
																				 const tcu::Vec2&	pb,
																				 float				wb,
																				 const tcu::IVec2&	pixel,
																				 int				subpixelBits,
																				 WeightEquation		weightEquation)
{
	// allow interpolation weights anywhere in the central subpixels
	const float testSquareSize = (2.0f / (float)(1UL << subpixelBits));
	const float testSquarePos  = (0.5f - testSquareSize / 2);

	const tcu::Vec2 corners[4] =
	{
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + 0.0f),
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + 0.0f),
	};

	// calculate interpolation as a line
	const LineInterpolationRange weights[4] =
	{
		weightEquation(pa, wa, pb, wb, corners[0]),
		weightEquation(pa, wa, pb, wb, corners[1]),
		weightEquation(pa, wa, pb, wb, corners[2]),
		weightEquation(pa, wa, pb, wb, corners[3]),
	};

	const tcu::Vec2 minWeights = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
	const tcu::Vec2 maxWeights = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));

	LineInterpolationRange result;
	result.min = minWeights;
	result.max = maxWeights;
	return result;
}